

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

QByteArray * QSysInfo::bootUniqueId(void)

{
  int __fd;
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char uuid [36];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined4 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    __fd = open64("/proc/sys/kernel/random/boot_id",0x80000,0x1ff);
    if (__fd != -1) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaa;
      goto LAB_00219915;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  goto LAB_00219977;
  while (piVar2 = __errno_location(), *piVar2 == 4) {
LAB_00219915:
    sVar3 = read(__fd,&local_58,0x24);
    if (sVar3 != -1) break;
  }
  do {
    iVar1 = close(__fd);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (sVar3 == 0x24) {
    QByteArray::QByteArray(in_RDI,(char *)&local_58,0x24);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return in_RDI;
    }
    goto LAB_002199a3;
  }
LAB_00219977:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char *)0x0;
    (in_RDI->d).size = 0;
    return in_RDI;
  }
LAB_002199a3:
  __stack_chk_fail();
}

Assistant:

QByteArray QSysInfo::bootUniqueId()
{
#ifdef Q_OS_LINUX
    // use low-level API here for simplicity
    int fd = qt_safe_open("/proc/sys/kernel/random/boot_id", O_RDONLY);
    if (fd != -1) {
        char uuid[UuidStringLen];
        qint64 len = qt_safe_read(fd, uuid, sizeof(uuid));
        qt_safe_close(fd);
        if (len == UuidStringLen)
            return QByteArray(uuid, UuidStringLen);
    }
#elif defined(Q_OS_DARWIN)
    // "kern.bootsessionuuid" is only available by name
    char uuid[UuidStringLen + 1];
    size_t uuidlen = sizeof(uuid);
    if (sysctlbyname("kern.bootsessionuuid", uuid, &uuidlen, nullptr, 0) == 0
            && uuidlen == sizeof(uuid))
        return QByteArray(uuid, uuidlen - 1);
#endif
    return QByteArray();
}